

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcgen.cpp
# Opt level: O0

void CTcIdFixup::add_fixup(CTcIdFixup **list_head,CTcDataStream *ds,ulong ofs,ulong id)

{
  CTcIdFixup *this;
  ulong in_RCX;
  ulong in_RDX;
  CTcDataStream *in_RSI;
  undefined8 *in_RDI;
  CTcIdFixup *fixup;
  CTcPrsMem *in_stack_ffffffffffffffc8;
  size_t in_stack_ffffffffffffffd0;
  
  this = (CTcIdFixup *)
         CTcCSPrsAllocObj::operator_new(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  CTcIdFixup(this,in_RSI,in_RDX,in_RCX);
  this->nxt_ = (CTcIdFixup *)*in_RDI;
  *in_RDI = this;
  return;
}

Assistant:

void CTcIdFixup::add_fixup(CTcIdFixup **list_head, class CTcDataStream *ds,
                           ulong ofs, ulong id)
{
    CTcIdFixup *fixup;
    
    /* create the new fixup object */
    fixup = new (G_prsmem) CTcIdFixup(ds, ofs, id);

    /* link it in at the head of the list */
    fixup->nxt_ = *list_head;
    *list_head = fixup;
}